

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getGlobal
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  Global *__k;
  mapped_type *pmVar1;
  Export *pEVar2;
  mapped_type *pmVar3;
  variant<wasm::Name,_wasm::HeapType> *pvVar4;
  
  __k = Module::getGlobal(this->wasm,name);
  if ((__k->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
    do {
      pmVar1 = std::
               map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
               ::at(&this->linkedInstances,&(__k->super_Importable).module);
      this = &((pmVar1->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_ModuleRunnerBase<wasm::ModuleRunner>;
      pEVar2 = Module::getExport(this->wasm,(Name)(__k->super_Importable).base.super_IString.str);
      pvVar4 = &pEVar2->value;
      if (*(__index_type *)
           ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) != '\0') {
        pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      __k = Module::getGlobal(this->wasm,
                              (IString)*(IString *)
                                        &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                         super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                         super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                         super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                         super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                         super__Variant_storage_alias<wasm::Name,_wasm::HeapType>.
                                         _M_u);
    } while ((__k->super_Importable).module.super_IString.str._M_str != (char *)0x0);
  }
  pmVar3 = std::
           map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
           ::operator[](&this->globals,(key_type *)__k);
  return pmVar3;
}

Assistant:

Literals& getGlobal(Name name) {
    auto* inst = self();
    auto* global = inst->wasm.getGlobal(name);
    while (global->imported()) {
      inst = inst->linkedInstances.at(global->module).get();
      Export* globalExport = inst->wasm.getExport(global->base);
      global = inst->wasm.getGlobal(*globalExport->getInternalName());
    }

    return inst->globals[global->name];
  }